

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

void __thiscall Graph<Node>::connectedComponents(Graph<Node> *this)

{
  int iVar1;
  int iVar2;
  bool *pbVar3;
  vector<int> *pvVar4;
  int *piVar5;
  int local_4c;
  int local_48;
  int currNode;
  int j;
  int i_1;
  int i;
  undefined1 local_30 [8];
  vector<int> currComp;
  vector<bool> used;
  Graph<Node> *this_local;
  
  vector<bool>::vector((vector<bool> *)&currComp._size,this->_nodeCnt);
  vector<int>::vector((vector<int> *)local_30);
  for (j = 0; j < this->_nodeCnt; j = j + 1) {
    pbVar3 = vector<bool>::operator[]((vector<bool> *)&currComp._size,&j);
    if ((*pbVar3 & 1U) == 0) {
      vector<int>::clear((vector<int> *)local_30);
      currCC(this,(vector<int> *)local_30,(vector<bool> *)&currComp._size,&j);
      vector<vector<int>_>::push_back(&this->compList,(vector<int> *)local_30);
    }
  }
  vector<int>::resize(&this->inCC,this->_nodeCnt);
  currNode = 0;
  while( true ) {
    iVar1 = currNode;
    iVar2 = vector<vector<int>_>::size(&this->compList);
    if (iVar2 <= iVar1) break;
    local_48 = 0;
    while( true ) {
      iVar1 = local_48;
      pvVar4 = vector<vector<int>_>::operator[](&this->compList,&currNode);
      iVar2 = vector<int>::size(pvVar4);
      if (iVar2 <= iVar1) break;
      pvVar4 = vector<vector<int>_>::operator[](&this->compList,&currNode);
      piVar5 = vector<int>::operator[](pvVar4,&local_48);
      iVar1 = currNode;
      local_4c = *piVar5;
      piVar5 = vector<int>::operator[](&this->inCC,&local_4c);
      *piVar5 = iVar1;
      local_48 = local_48 + 1;
    }
    currNode = currNode + 1;
  }
  vector<int>::~vector((vector<int> *)local_30);
  vector<bool>::~vector((vector<bool> *)&currComp._size);
  return;
}

Assistant:

void connectedComponents() {
        vector <bool> used(_nodeCnt);
        vector <int> currComp;

        for (int i = 0; i < _nodeCnt; ++i) {
            if (!used[i]) {
                currComp.clear();
                currCC(currComp, used, i);
                compList.push_back(currComp);
            }
        }

        inCC.resize(_nodeCnt);
        for (int i = 0; i < compList.size(); ++i) {
            for (int j = 0; j < compList[i].size(); ++j) {
                int currNode = compList[i][j];
                inCC[currNode] = i;
            }
        }
    }